

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# denoise.c
# Opt level: O0

void compute_band_corr(float *bandE,kiss_fft_cpx *X,kiss_fft_cpx *P)

{
  int iVar1;
  float fVar2;
  float fVar3;
  float frac;
  float tmp;
  int band_size;
  int j;
  float sum [22];
  int local_24;
  int i;
  kiss_fft_cpx *P_local;
  kiss_fft_cpx *X_local;
  float *bandE_local;
  
  memset(&band_size,0,0x58);
  for (local_24 = 0; local_24 < 0x15; local_24 = local_24 + 1) {
    iVar1 = ((int)eband5ms[local_24 + 1] - (int)eband5ms[local_24]) * 4;
    for (tmp = 0.0; (int)tmp < iVar1; tmp = (float)((int)tmp + 1)) {
      fVar2 = (float)(int)tmp / (float)iVar1;
      fVar3 = X[eband5ms[local_24] * 4 + (int)tmp].i * P[eband5ms[local_24] * 4 + (int)tmp].i +
              X[eband5ms[local_24] * 4 + (int)tmp].r * P[eband5ms[local_24] * 4 + (int)tmp].r;
      (&band_size)[local_24] = (int)((1.0 - fVar2) * fVar3 + (float)(&band_size)[local_24]);
      (&band_size)[local_24 + 1] = (int)(fVar2 * fVar3 + (float)(&band_size)[local_24 + 1]);
    }
  }
  band_size = (int)((float)band_size * 2.0);
  sum[0x13] = sum[0x13] * 2.0;
  for (local_24 = 0; local_24 < 0x16; local_24 = local_24 + 1) {
    bandE[local_24] = (float)(&band_size)[local_24];
  }
  return;
}

Assistant:

void compute_band_corr(float *bandE, const kiss_fft_cpx *X, const kiss_fft_cpx *P) {
    int i;
    float sum[NB_BANDS] = {0};
    for (i = 0; i < NB_BANDS - 1; i++) {
        int j;
        int band_size;
        band_size = (eband5ms[i + 1] - eband5ms[i]) << FRAME_SIZE_SHIFT;
        for (j = 0; j < band_size; j++) {
            float tmp;
            float frac = (float) j / band_size;
            tmp = X[(eband5ms[i] << FRAME_SIZE_SHIFT) + j].r * P[(eband5ms[i] << FRAME_SIZE_SHIFT) + j].r;
            tmp += X[(eband5ms[i] << FRAME_SIZE_SHIFT) + j].i * P[(eband5ms[i] << FRAME_SIZE_SHIFT) + j].i;
            sum[i] += (1 - frac) * tmp;
            sum[i + 1] += frac * tmp;
        }
    }
    sum[0] *= 2;
    sum[NB_BANDS - 1] *= 2;
    for (i = 0; i < NB_BANDS; i++) {
        bandE[i] = sum[i];
    }
}